

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

int __thiscall
helics::zeromq::ZmqComms::initializeBrokerConnections(ZmqComms *this,socket_t *controlSocket)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  socket_base *this_00;
  bool bVar1;
  uint uVar2;
  __int_type_conflict _Var3;
  CommsInterface *in_RCX;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  int __fd;
  socket_base *in_RSI;
  CommsInterface *in_RDI;
  int in_R8D;
  string str_1;
  ActionMessage setPorts;
  ActionMessage M_5;
  error_t *ze_2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  ActionMessage rxcmd;
  ActionMessage M_4;
  ActionMessage M_3;
  error_t *ze_1;
  ActionMessage M_2;
  int rc;
  string str;
  ActionMessage getPorts;
  ActionMessage M_1;
  int cnt2;
  int cnt;
  message_t msg;
  ActionMessage M;
  error_t *ze;
  socket_t brokerReq;
  shared_ptr<ZmqContextManager> ctx;
  pollitem_t poller;
  string *in_stack_fffffffffffff178;
  int32_t data;
  ActionMessage *in_stack_fffffffffffff180;
  __int_type_conflict __i;
  ActionMessage *this_01;
  undefined4 in_stack_fffffffffffff188;
  ConnectionStatus in_stack_fffffffffffff18c;
  undefined4 in_stack_fffffffffffff190;
  int in_stack_fffffffffffff194;
  undefined4 in_stack_fffffffffffff198;
  action_t in_stack_fffffffffffff19c;
  ActionMessage *in_stack_fffffffffffff1a0;
  undefined7 in_stack_fffffffffffff1a8;
  undefined1 in_stack_fffffffffffff1af;
  CommsInterface *in_stack_fffffffffffff1b0;
  undefined4 in_stack_fffffffffffff1b8;
  int in_stack_fffffffffffff1bc;
  CommsInterface *in_stack_fffffffffffff1c0;
  ActionMessage *in_stack_fffffffffffff1d8;
  void *in_stack_fffffffffffff1e0;
  undefined7 in_stack_fffffffffffff1e8;
  undefined1 in_stack_fffffffffffff1ef;
  CommsInterface *in_stack_fffffffffffff1f0;
  socket_base *in_stack_fffffffffffff1f8;
  undefined4 in_stack_fffffffffffff200;
  ConnectionStatus in_stack_fffffffffffff204;
  undefined1 local_d80 [8];
  string *in_stack_fffffffffffff288;
  ActionMessage local_d60;
  int local_ca4;
  duration<long,std::ratio<1l,1l>> local_ca0 [480];
  undefined1 local_ac0 [64];
  uint local_a80;
  ActionMessage *in_stack_fffffffffffff5a8;
  int local_a14;
  undefined1 local_950 [36];
  undefined4 local_92c;
  undefined1 local_6a0 [36];
  undefined4 local_67c;
  __sv_type local_608;
  allocator<char> local_5d1 [65];
  __sv_type local_590;
  undefined1 local_570 [36];
  undefined4 local_54c;
  rep local_488;
  int local_47c;
  undefined1 local_478 [32];
  ActionMessage local_458;
  undefined1 local_3a0 [36];
  undefined4 local_37c;
  uint local_2c8;
  int local_2c4;
  ActionMessage local_2c0 [2];
  undefined1 local_a0 [36];
  undefined4 local_7c;
  socket_t local_78 [5];
  pollfd local_28;
  undefined2 local_1c;
  socket_base *local_18;
  int local_4;
  
  local_18 = in_RSI;
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
    ZmqContextManager::getContextPointer
              ((string *)CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff180);
    if (*(int *)&in_RDI[1]._vptr_CommsInterface < 0) {
      uVar2 = getDefaultBrokerPort((ZmqComms *)0x4ae333);
      in_RCX = (CommsInterface *)(ulong)uVar2;
      *(uint *)&in_RDI[1]._vptr_CommsInterface = uVar2;
    }
    CLI::std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4ae39f);
    ZmqContextManager::getBaseContext((ZmqContextManager *)0x4ae3a7);
    zmq::socket_t::socket_t
              ((socket_t *)in_stack_fffffffffffff1a0,
               (context_t *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
               in_stack_fffffffffffff194);
    local_7c = 0x32;
    zmq::detail::socket_base::setsockopt<int>
              ((socket_base *)in_stack_fffffffffffff180,
               (int)((ulong)in_stack_fffffffffffff178 >> 0x20),(int *)0x4ae3f2);
    gmlc::networking::makePortAddress
              ((string *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
               (int)((ulong)in_stack_fffffffffffff1b0 >> 0x20));
    zmq::detail::socket_base::connect
              (&local_78[0].super_socket_base,(int)local_a0,__addr,(socklen_t)in_RCX);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff180);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffff180,
               SUB81((ulong)in_stack_fffffffffffff178 >> 0x38,0));
    zmq::message_t::message_t((message_t *)in_stack_fffffffffffff180);
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
    if (_Var3 < 0) {
      local_2c4 = 0;
      local_2c8 = 0;
      do {
        _Var3 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)
                           CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
        if (-1 < _Var3) goto LAB_004affb4;
        bVar1 = CLI::std::atomic<bool>::load
                          ((atomic<bool> *)
                           CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188),
                           (memory_order)((ulong)in_stack_fffffffffffff180 >> 0x20));
        if (bVar1) {
          ActionMessage::ActionMessage(in_stack_fffffffffffff1a0,in_stack_fffffffffffff19c);
          local_37c = 0x9db;
          ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffff1d8);
          zmq::detail::socket_base::send(local_18,(int)local_3a0,(void *)0x0,(size_t)in_RCX,in_R8D);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff180);
          local_4 = -3;
          local_2c0[0].payload.buffer._M_elems[4] = 1;
          local_2c0[0].payload.buffer._M_elems[5] = 0;
          local_2c0[0].payload.buffer._M_elems[6] = 0;
          local_2c0[0].payload.buffer._M_elems[7] = 0;
          ActionMessage::~ActionMessage(in_stack_fffffffffffff180);
          break;
        }
        NetworkCommsInterface::generatePortRequest
                  ((NetworkCommsInterface *)
                   CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                   (int)((ulong)in_stack_fffffffffffff1e0 >> 0x20));
        if ((in_RDI->useJsonSerialization & 1U) != 0) {
          setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                    (&local_458,use_json_serialization_flag);
        }
        if ((in_RDI->useJsonSerialization & 1U) == 0) {
          ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffff1d8);
        }
        else {
          ActionMessage::to_json_string_abi_cxx11_(in_stack_fffffffffffff5a8);
        }
        zmq::detail::socket_base::send
                  (&local_78[0].super_socket_base,(int)local_478,(void *)0x0,(size_t)in_RCX,in_R8D);
        local_28 = (pollfd)zmq::socket_t::operator_cast_to_void_(local_78);
        local_1c = 1;
        local_47c = 0;
        do {
          if (local_47c != 0) goto LAB_004af579;
          local_2c8 = local_2c8 + 1;
          in_RCX = (CommsInterface *)(ulong)local_2c8;
          local_488 = (in_RDI->connectionTimeout).__r;
          local_47c = zmq::poll(&local_28,1,(int)local_488);
          if (local_47c < 0) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                       (char *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
            message._M_str._0_4_ = in_stack_fffffffffffff200;
            message._M_len = (size_t)in_stack_fffffffffffff1f8;
            message._M_str._4_4_ = in_stack_fffffffffffff204;
            CommsInterface::logError(in_stack_fffffffffffff1f0,message);
            CommsInterface::setTxStatus
                      ((CommsInterface *)
                       CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                       in_stack_fffffffffffff18c);
            goto LAB_004af579;
          }
        } while (local_47c != 0);
        __fd = 2;
        bVar1 = CLI::std::atomic<bool>::load
                          ((atomic<bool> *)
                           CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188),
                           (memory_order)((ulong)in_stack_fffffffffffff180 >> 0x20));
        if (bVar1) {
          ActionMessage::ActionMessage(in_stack_fffffffffffff1a0,in_stack_fffffffffffff19c);
          this_00 = local_18;
          local_54c = 0x9db;
          ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffff1d8);
          zmq::detail::socket_base::send(this_00,(int)local_570,(void *)0x0,(size_t)in_RCX,in_R8D);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff180);
          local_4 = -3;
          local_2c0[0].payload.buffer._M_elems[4] = 1;
          local_2c0[0].payload.buffer._M_elems[5] = 0;
          local_2c0[0].payload.buffer._M_elems[6] = 0;
          local_2c0[0].payload.buffer._M_elems[7] = 0;
          ActionMessage::~ActionMessage(in_stack_fffffffffffff180);
        }
        else {
          if (local_2c8 == 1) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                       (char *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
            message_00._M_str._0_4_ = in_stack_fffffffffffff200;
            message_00._M_len = (size_t)in_stack_fffffffffffff1f8;
            message_00._M_str._4_4_ = in_stack_fffffffffffff204;
            CommsInterface::logWarning(in_stack_fffffffffffff1f0,message_00);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff1c0,
                       (char *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
                       (allocator<char> *)in_stack_fffffffffffff1b0);
            gmlc::networking::makePortAddress
                      ((string *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
                       (int)((ulong)in_stack_fffffffffffff1b0 >> 0x20));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff1b0);
            local_590 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff180);
            __fd = (int)local_590._M_len;
            message_01._M_str._0_4_ = in_stack_fffffffffffff200;
            message_01._M_len = (size_t)in_stack_fffffffffffff1f8;
            message_01._M_str._4_4_ = in_stack_fffffffffffff204;
            CommsInterface::logWarning(in_stack_fffffffffffff1f0,message_01);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            std::allocator<char>::~allocator(local_5d1);
LAB_004af020:
            zmq::socket_t::close(local_78,__fd);
            CLI::std::
            __shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4af03a);
            ZmqContextManager::getBaseContext((ZmqContextManager *)0x4af042);
            zmq::socket_t::socket_t
                      ((socket_t *)in_stack_fffffffffffff1a0,
                       (context_t *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                       in_stack_fffffffffffff194);
            zmq::socket_t::operator=
                      ((socket_t *)in_stack_fffffffffffff180,(socket_t *)in_stack_fffffffffffff178);
            zmq::socket_t::~socket_t((socket_t *)0x4af09a);
            local_67c = 0x32;
            zmq::detail::socket_base::setsockopt<int>
                      ((socket_base *)in_stack_fffffffffffff180,
                       (int)((ulong)in_stack_fffffffffffff178 >> 0x20),(int *)0x4af0bf);
            gmlc::networking::makePortAddress
                      ((string *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8),
                       (int)((ulong)in_stack_fffffffffffff1b0 >> 0x20));
            zmq::detail::socket_base::connect
                      (&local_78[0].super_socket_base,(int)local_6a0,__addr_00,(socklen_t)in_RCX);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            local_28 = (pollfd)zmq::socket_t::operator_cast_to_void_(local_78);
          }
          else {
            in_RCX = in_RDI;
            if ((int)local_2c8 <= *(int *)&in_RDI[1].rxTrigger.field_0x4) goto LAB_004af020;
            CLI::std::__cxx11::to_string(in_stack_fffffffffffff1bc);
            std::operator+((char *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff180);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188),
                           (char *)in_stack_fffffffffffff180);
            local_608 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff180);
            message_02._M_str._0_4_ = in_stack_fffffffffffff200;
            message_02._M_len = (size_t)in_stack_fffffffffffff1f8;
            message_02._M_str._4_4_ = in_stack_fffffffffffff204;
            CommsInterface::logError(in_stack_fffffffffffff1f0,message_02);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            CommsInterface::setTxStatus
                      ((CommsInterface *)
                       CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                       in_stack_fffffffffffff18c);
          }
LAB_004af579:
          in_stack_fffffffffffff204 = CommsInterface::getTxStatus((CommsInterface *)0x4af586);
          if (in_stack_fffffffffffff204 == ERRORED) {
            ActionMessage::ActionMessage(in_stack_fffffffffffff1a0,in_stack_fffffffffffff19c);
            local_92c = 0xa3f;
            in_stack_fffffffffffff1f8 = local_18;
            ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffff1d8);
            zmq::detail::socket_base::send
                      (in_stack_fffffffffffff1f8,(int)local_950,(void *)0x0,(size_t)in_RCX,in_R8D);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff180);
            local_4 = -1;
            local_2c0[0].payload.buffer._M_elems[4] = 1;
            local_2c0[0].payload.buffer._M_elems[5] = 0;
            local_2c0[0].payload.buffer._M_elems[6] = 0;
            local_2c0[0].payload.buffer._M_elems[7] = 0;
            ActionMessage::~ActionMessage(in_stack_fffffffffffff180);
          }
          else {
            if (0 < local_47c) {
              in_RCX = (CommsInterface *)
                       zmq::detail::socket_base::recv
                                 (&local_78[0].super_socket_base,(int)local_2c0,(void *)0x0,
                                  (size_t)in_RCX,in_R8D);
              in_stack_fffffffffffff1d8 = local_2c0;
              in_stack_fffffffffffff1ef = extraout_DL;
              in_stack_fffffffffffff1f0 = in_RCX;
              in_stack_fffffffffffff1e0 =
                   zmq::message_t::data((message_t *)in_stack_fffffffffffff180);
              zmq::message_t::size((message_t *)in_stack_fffffffffffff180);
              ActionMessage::ActionMessage
                        ((ActionMessage *)in_stack_fffffffffffff1b0,
                         (void *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8),
                         (size_t)in_stack_fffffffffffff1a0);
              bVar1 = isProtocolCommand(in_stack_fffffffffffff180);
              if (!bVar1) goto LAB_004afed2;
              if (local_a14 == 0x5ab) {
                in_RCX = (CommsInterface *)
                         zmq::detail::socket_base::send
                                   (local_18,(int)local_2c0,(void *)0x0,(size_t)in_RCX,in_R8D);
                local_4 = 0;
                local_2c0[0].payload.buffer._M_elems[4] = 1;
                local_2c0[0].payload.buffer._M_elems[5] = 0;
                local_2c0[0].payload.buffer._M_elems[6] = 0;
                local_2c0[0].payload.buffer._M_elems[7] = 0;
              }
              else if (local_a14 == 0x9db) {
                in_RCX = (CommsInterface *)
                         zmq::detail::socket_base::send
                                   (local_18,(int)local_2c0,(void *)0x0,(size_t)in_RCX,in_R8D);
                in_stack_fffffffffffff1bc = CONCAT13(extraout_DL_00,(int3)in_stack_fffffffffffff1bc)
                ;
                in_stack_fffffffffffff1c0 = in_RCX;
                CommsInterface::setTxStatus
                          ((CommsInterface *)
                           CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                           in_stack_fffffffffffff18c);
                local_4 = -3;
                local_2c0[0].payload.buffer._M_elems[4] = 1;
                local_2c0[0].payload.buffer._M_elems[5] = 0;
                local_2c0[0].payload.buffer._M_elems[6] = 0;
                local_2c0[0].payload.buffer._M_elems[7] = 0;
              }
              else if (local_a14 == 0xa3f) {
                in_RCX = (CommsInterface *)
                         zmq::detail::socket_base::send
                                   (local_18,(int)local_2c0,(void *)0x0,(size_t)in_RCX,in_R8D);
                in_stack_fffffffffffff1af = extraout_DL_01;
                in_stack_fffffffffffff1b0 = in_RCX;
                CommsInterface::setTxStatus
                          ((CommsInterface *)
                           CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                           in_stack_fffffffffffff18c);
                local_4 = -4;
                local_2c0[0].payload.buffer._M_elems[4] = 1;
                local_2c0[0].payload.buffer._M_elems[5] = 0;
                local_2c0[0].payload.buffer._M_elems[6] = 0;
                local_2c0[0].payload.buffer._M_elems[7] = 0;
              }
              else {
                if (local_a14 == 0x14d) {
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                             (char *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
                  message_03._M_str._0_4_ = in_stack_fffffffffffff200;
                  message_03._M_len = (size_t)in_stack_fffffffffffff1f8;
                  message_03._M_str._4_4_ = in_stack_fffffffffffff204;
                  CommsInterface::logMessage(in_stack_fffffffffffff1f0,message_03);
                  gmlc::networking::makePortAddress
                            ((string *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8)
                             ,(int)((ulong)in_stack_fffffffffffff1b0 >> 0x20));
                  zmq::detail::socket_base::disconnect
                            ((socket_base *)in_stack_fffffffffffff180,in_stack_fffffffffffff178);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff180);
                  in_stack_fffffffffffff1a0 =
                       (ActionMessage *)
                       ActionMessage::getString_abi_cxx11_
                                 ((ActionMessage *)
                                  CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188),
                                  (int)((ulong)in_stack_fffffffffffff180 >> 0x20));
                  gmlc::networking::extractInterfaceAndPort(in_stack_fffffffffffff288);
                  in_RCX = (CommsInterface *)(ulong)local_a80;
                  *(uint *)&in_RDI[1]._vptr_CommsInterface = local_a80;
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffff180,
                                          (char *)in_stack_fffffffffffff178);
                  in_stack_fffffffffffff19c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff19c);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff180,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff178);
                  }
                  gmlc::networking::makePortAddress
                            ((string *)CONCAT44(in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8)
                             ,(int)((ulong)in_stack_fffffffffffff1b0 >> 0x20));
                  zmq::detail::socket_base::connect
                            (&local_78[0].super_socket_base,(int)local_ac0,__addr_01,
                             (socklen_t)in_RCX);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff180);
                  local_2c0[0].payload.buffer._M_elems[4] = 0;
                  local_2c0[0].payload.buffer._M_elems[5] = 0;
                  local_2c0[0].payload.buffer._M_elems[6] = 0;
                  local_2c0[0].payload.buffer._M_elems[7] = 0;
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                           *)0x4afe70);
                  if (local_2c0[0].payload.buffer._M_elems._4_4_ != 0) goto LAB_004afedd;
                }
                else if (local_a14 == 0xed3) {
                  local_ca4 = 2;
                  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                            (local_ca0,&local_ca4);
                  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                            ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff1c0);
                }
LAB_004afed2:
                local_2c0[0].payload.buffer._M_elems[4] = 0;
                local_2c0[0].payload.buffer._M_elems[5] = 0;
                local_2c0[0].payload.buffer._M_elems[6] = 0;
                local_2c0[0].payload.buffer._M_elems[7] = 0;
              }
LAB_004afedd:
              ActionMessage::~ActionMessage(in_stack_fffffffffffff180);
              if (local_2c0[0].payload.buffer._M_elems._4_4_ != 0) goto LAB_004aff6a;
            }
            local_2c4 = local_2c4 + 1;
            if (*(int *)&in_RDI[1].rxTrigger.field_0x4 < local_2c4) {
              in_RCX = in_RDI;
              CommsInterface::setTxStatus
                        ((CommsInterface *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                         in_stack_fffffffffffff18c);
              local_4 = -1;
              local_2c0[0].payload.buffer._M_elems[4] = 1;
              local_2c0[0].payload.buffer._M_elems[5] = 0;
              local_2c0[0].payload.buffer._M_elems[6] = 0;
              local_2c0[0].payload.buffer._M_elems[7] = 0;
            }
            else {
              local_2c0[0].payload.buffer._M_elems[4] = 0;
              local_2c0[0].payload.buffer._M_elems[5] = 0;
              local_2c0[0].payload.buffer._M_elems[6] = 0;
              local_2c0[0].payload.buffer._M_elems[7] = 0;
              in_RCX = in_RDI;
            }
          }
        }
LAB_004aff6a:
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff180);
        ActionMessage::~ActionMessage(in_stack_fffffffffffff180);
      } while (local_2c0[0].payload.buffer._M_elems._4_4_ == 0);
    }
    else {
LAB_004affb4:
      local_2c0[0].payload.buffer._M_elems[4] = 0;
      local_2c0[0].payload.buffer._M_elems[5] = 0;
      local_2c0[0].payload.buffer._M_elems[6] = 0;
      local_2c0[0].payload.buffer._M_elems[7] = 0;
    }
    zmq::message_t::~message_t((message_t *)in_stack_fffffffffffff180);
    zmq::socket_t::~socket_t((socket_t *)0x4affd9);
    CLI::std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x4affe6);
    if (local_2c0[0].payload.buffer._M_elems._4_4_ != 0) {
      return local_4;
    }
  }
  else {
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188));
    __i = (__int_type_conflict)((ulong)in_stack_fffffffffffff180 >> 0x20);
    if (_Var3 < 0) {
      getDefaultBrokerPort((ZmqComms *)0x4b0053);
      data = (int32_t)((ulong)((long)&in_RDI[1]._vptr_CommsInterface + 4) >> 0x20);
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188)
                 ,__i);
      this_01 = &local_d60;
      ActionMessage::ActionMessage(in_stack_fffffffffffff1a0,in_stack_fffffffffffff19c);
      local_d60.messageID = 0x5ab;
      std::__atomic_base::operator_cast_to_int
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff18c,in_stack_fffffffffffff188)
                );
      ActionMessage::setExtraData(this_01,data);
      ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffff1d8);
      zmq::detail::socket_base::send(local_18,(int)local_d80,(void *)0x0,(size_t)in_RCX,in_R8D);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      ActionMessage::~ActionMessage(this_01);
    }
  }
  return 0;
}

Assistant:

int ZmqComms::initializeBrokerConnections(zmq::socket_t& controlSocket)
{
    zmq::pollitem_t poller;
    if (hasBroker) {
        auto ctx = ZmqContextManager::getContextPointer();
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }

        zmq::socket_t brokerReq(ctx->getBaseContext(), ZMQ_REQ);
        brokerReq.setsockopt(ZMQ_LINGER, 50);
        try {
            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
        }
        catch (zmq::error_t& ze) {
            logError(std::string("unable to connect with broker at ") +
                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" + name + ")" +
                     ze.what());
            setTxStatus(ConnectionStatus::ERRORED);
            ActionMessage M(CMD_PROTOCOL);
            M.messageID = DISCONNECT_ERROR;
            controlSocket.send(M.to_string());
            return (-1);
        }

        hasBroker = true;
        zmq::message_t msg;
        if (PortNumber < 0) {
            int cnt = 0;

            int cnt2 = 0;
            while (PortNumber < 0) {
                if (requestDisconnect.load(std::memory_order_acquire)) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT;
                    controlSocket.send(M.to_string());
                    return (-3);
                }
                ActionMessage getPorts = generatePortRequest((serverMode) ? 2 : 1);
                if (useJsonSerialization) {
                    setActionFlag(getPorts, use_json_serialization_flag);
                }
                auto str =
                    (useJsonSerialization) ? getPorts.to_json_string() : getPorts.to_string();

                brokerReq.send(str);
                poller.socket = static_cast<void*>(brokerReq);
                poller.events = ZMQ_POLLIN;
                int rc = 0;
                while (rc == 0) {
                    ++cnt2;
                    rc = zmq::poll(&poller, 1, connectionTimeout);
                    if (rc < 0) {
                        logError("ZMQ broker connection error (2)");
                        setTxStatus(ConnectionStatus::ERRORED);
                        break;
                    }
                    if (rc == 0) {
                        if (requestDisconnect.load(std::memory_order_acquire)) {
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT;
                            controlSocket.send(M.to_string());
                            return (-3);
                        }
                        if (cnt2 == 1) {
                            logWarning("zmq broker connection timed out, trying again (2)");
                            logWarning(std::string("sending message to ") +
                                       makePortAddress(brokerTargetAddress, brokerPort + 1));
                        } else if (cnt2 > maxRetries) {
                            logError("zmq broker connection timed out after trying " +
                                     std::to_string(maxRetries) + " times (2)");
                            setTxStatus(ConnectionStatus::ERRORED);
                            break;
                        }
                        // try to reestablish the connection
                        brokerReq.close();
                        brokerReq = zmq::socket_t(ctx->getBaseContext(), ZMQ_REQ);
                        brokerReq.setsockopt(ZMQ_LINGER, 50);
                        try {
                            brokerReq.connect(makePortAddress(brokerTargetAddress, brokerPort + 1));
                            poller.socket = static_cast<void*>(brokerReq);
                        }
                        catch (zmq::error_t& ze) {
                            logError(std::string("unable to connect with broker at ") +
                                     makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" +
                                     name + ")" + ze.what());
                            setTxStatus(ConnectionStatus::ERRORED);
                            ActionMessage M(CMD_PROTOCOL);
                            M.messageID = DISCONNECT_ERROR;
                            controlSocket.send(M.to_string());
                            return (-1);
                        }
                        break;
                    }
                }

                if (getTxStatus() == ConnectionStatus::ERRORED) {
                    ActionMessage M(CMD_PROTOCOL);
                    M.messageID = DISCONNECT_ERROR;
                    controlSocket.send(M.to_string());
                    return (-1);
                }
                if (rc > 0) {
                    brokerReq.recv(msg);

                    ActionMessage rxcmd(static_cast<std::byte*>(msg.data()), msg.size());
                    if (isProtocolCommand(rxcmd)) {
                        if (rxcmd.messageID == PORT_DEFINITIONS) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            return 0;
                        }
                        if (rxcmd.messageID == DISCONNECT) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::TERMINATED);
                            return (-3);
                        }
                        if (rxcmd.messageID == DISCONNECT_ERROR) {
                            controlSocket.send(msg, zmq::send_flags::none);
                            setTxStatus(ConnectionStatus::ERRORED);
                            return (-4);
                        }
                        if (rxcmd.messageID == NEW_BROKER_INFORMATION) {
                            logMessage("got new broker information");
                            brokerReq.disconnect(
                                makePortAddress(brokerTargetAddress, brokerPort + 1));
                            auto brkprt =
                                gmlc::networking::extractInterfaceAndPort(rxcmd.getString(0));
                            brokerPort = brkprt.second;
                            if (brkprt.first != "?") {
                                brokerTargetAddress = brkprt.first;
                            }
                            try {
                                brokerReq.connect(
                                    makePortAddress(brokerTargetAddress, brokerPort + 1));
                            }
                            catch (zmq::error_t& ze) {
                                logError(std::string("unable to connect with broker at ") +
                                         makePortAddress(brokerTargetAddress, brokerPort + 1) +
                                         ":(" + name + ")" + ze.what());
                                setTxStatus(ConnectionStatus::ERRORED);
                                ActionMessage M(CMD_PROTOCOL);
                                M.messageID = DISCONNECT_ERROR;
                                controlSocket.send(M.to_string());
                                return (-1);
                            }
                        } else if (rxcmd.messageID == DELAY_CONNECTION) {
                            std::this_thread::sleep_for(std::chrono::seconds(2));
                        }
                    }
                }
                ++cnt;
                if (cnt > maxRetries) {
                    // we can't get the broker to respond with port numbers
                    setTxStatus(ConnectionStatus::ERRORED);
                    return (-1);
                }
            }
        }
    } else {
        if ((PortNumber < 0)) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage setPorts(CMD_PROTOCOL);
            setPorts.messageID = PORT_DEFINITIONS;
            setPorts.setExtraData(PortNumber);
            auto str = setPorts.to_string();
            controlSocket.send(str);
        }
    }
    return 0;
}